

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ModifyMaximalReconvergence::RemoveMaximalReconvergence
          (ModifyMaximalReconvergence *this)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  undefined1 local_40 [16];
  Instruction *mode;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_remove;
  bool changed;
  ModifyMaximalReconvergence *this_local;
  
  to_remove.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &mode);
  Pass::get_module(&this->super_Pass);
  Module::execution_mode_begin((Module *)local_40);
  local_40._8_8_ =
       utils::IntrusiveList<spvtools::opt::Instruction>::
       iterator_template<spvtools::opt::Instruction>::operator*
                 ((iterator_template<spvtools::opt::Instruction> *)local_40);
  while (((Instruction *)local_40._8_8_ != (Instruction *)0x0 &&
         ((OVar2 = Instruction::opcode((Instruction *)local_40._8_8_), OVar2 == OpExecutionMode ||
          (OVar2 = Instruction::opcode((Instruction *)local_40._8_8_), OVar2 == OpExecutionModeId)))
         )) {
    uVar3 = Instruction::GetSingleWordInOperand((Instruction *)local_40._8_8_,1);
    if (uVar3 == 0x1787) {
      pIVar4 = Pass::context(&this->super_Pass);
      local_40._8_8_ = IRContext::KillInst(pIVar4,(Instruction *)local_40._8_8_);
      to_remove.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    else {
      local_40._8_8_ =
           utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                     ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_40._8_8_);
    }
  }
  pIVar4 = Pass::context(&this->super_Pass);
  bVar1 = IRContext::RemoveExtension(pIVar4,kSPV_KHR_maximal_reconvergence);
  bVar1 = (to_remove.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0 || bVar1;
  to_remove.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = bVar1;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &mode);
  return bVar1;
}

Assistant:

bool ModifyMaximalReconvergence::RemoveMaximalReconvergence() {
  bool changed = false;
  std::vector<Instruction*> to_remove;
  Instruction* mode = &*get_module()->execution_mode_begin();
  while (mode) {
    if (mode->opcode() != spv::Op::OpExecutionMode &&
        mode->opcode() != spv::Op::OpExecutionModeId) {
      break;
    }
    if (spv::ExecutionMode(mode->GetSingleWordInOperand(1)) ==
        spv::ExecutionMode::MaximallyReconvergesKHR) {
      mode = context()->KillInst(mode);
      changed = true;
    } else {
      mode = mode->NextNode();
    }
  }

  changed |=
      context()->RemoveExtension(Extension::kSPV_KHR_maximal_reconvergence);
  return changed;
}